

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::collapse(QTreeView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QTreeViewPrivate *this_00;
  QModelIndex *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTreeViewPrivate *d;
  QWidget *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QModelIndex *in_stack_ffffffffffffff98;
  QSet<QPersistentModelIndex> *pQVar4;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  QModelIndex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar5;
  int in_stack_ffffffffffffffcc;
  uint uVar6;
  QPersistentModelIndex in_stack_ffffffffffffffe8;
  QPersistentModelIndex in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8f1b8f);
  bVar2 = QAbstractItemViewPrivate::isIndexValid
                    ((QAbstractItemViewPrivate *)
                     CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                     in_stack_ffffffffffffff98);
  if ((bVar2) &&
     (bVar2 = QTreeViewPrivate::isIndexExpanded
                        ((QTreeViewPrivate *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8), bVar2)) {
    QBasicTimer::stop();
    if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout & 1U) == 0) {
      iVar3 = QTreeViewPrivate::viewIndex
                        ((QTreeViewPrivate *)in_stack_fffffffffffffff0.d,
                         (QModelIndex *)in_stack_ffffffffffffffe8.d);
      if (iVar3 == -1) {
        bVar2 = QAbstractItemViewPrivate::isPersistent
                          ((QAbstractItemViewPrivate *)
                           CONCAT17(in_stack_ffffffffffffffa7,
                                    CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                           in_stack_ffffffffffffff98);
        bVar5 = 0;
        if (bVar2) {
          pQVar4 = &this_00->expandedIndexes;
          QPersistentModelIndex::QPersistentModelIndex
                    ((QPersistentModelIndex *)&stack0xffffffffffffffe8,in_RSI);
          iVar3 = QSet<QPersistentModelIndex>::remove(pQVar4,&stack0xffffffffffffffe8);
          bVar5 = (byte)iVar3;
          QPersistentModelIndex::~QPersistentModelIndex
                    ((QPersistentModelIndex *)&stack0xffffffffffffffe8);
        }
        if ((bVar5 & 1) != 0) {
          collapsed((QTreeView *)CONCAT17(bVar5,in_stack_ffffffffffffff90),
                    (QModelIndex *)in_stack_ffffffffffffff88);
        }
      }
      else {
        QTreeViewPrivate::collapse(this_00,in_stack_ffffffffffffffcc,SUB41((uint)iVar3 >> 0x18,0));
        bVar2 = QAbstractItemViewPrivate::isAnimating(&this_00->super_QAbstractItemViewPrivate);
        if (!bVar2) {
          (**(code **)(*in_RDI + 0x268))();
          QAbstractScrollArea::viewport
                    ((QAbstractScrollArea *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
          QWidget::update(in_stack_ffffffffffffff88);
        }
      }
    }
    else {
      bVar2 = QAbstractItemViewPrivate::isPersistent
                        ((QAbstractItemViewPrivate *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                         in_stack_ffffffffffffff98);
      uVar6 = 0;
      bVar5 = 0;
      if (bVar2) {
        pQVar4 = &this_00->expandedIndexes;
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&stack0xfffffffffffffff0,in_RSI);
        uVar6 = 0x1000000;
        iVar3 = QSet<QPersistentModelIndex>::remove(pQVar4,&stack0xfffffffffffffff0);
        bVar5 = (byte)iVar3;
      }
      if ((uVar6 & 0x1000000) != 0) {
        QPersistentModelIndex::~QPersistentModelIndex
                  ((QPersistentModelIndex *)&stack0xfffffffffffffff0);
      }
      if ((bVar5 & 1) != 0) {
        collapsed((QTreeView *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                  (QModelIndex *)in_stack_ffffffffffffff88);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::collapse(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (!d->isIndexExpanded(index))
        return;
    //if the current item is now invisible, the autoscroll will expand the tree to see it, so disable the autoscroll
    d->delayedAutoScroll.stop();

    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just un-store the expanded index, no need to layout.
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
        return;
    }
    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->collapse(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            viewport()->update();
        }
    } else {
        if (d->isPersistent(index) && d->expandedIndexes.remove(index))
            emit collapsed(index);
    }
}